

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# example_files.cpp
# Opt level: O1

int main(void)

{
  FILE *__stream;
  uint uVar1;
  int iVar2;
  uchar *data;
  FILE *__stream_00;
  uchar uVar3;
  
  data = (uchar *)operator_new__(100);
  data[0] = '\0';
  data[1] = '\0';
  data[2] = '\0';
  data[3] = '\0';
  data[4] = '\0';
  data[5] = '\0';
  data[6] = '\0';
  data[7] = '\0';
  data[8] = '\0';
  data[9] = '\0';
  data[10] = '\0';
  data[0xb] = '\0';
  data[0xc] = '\0';
  data[0xd] = '\0';
  data[0xe] = '\0';
  data[0xf] = '\0';
  data[0x10] = '\0';
  data[0x11] = '\0';
  data[0x12] = '\0';
  data[0x13] = '\0';
  data[0x14] = '\0';
  data[0x15] = '\0';
  data[0x16] = '\0';
  data[0x17] = '\0';
  data[0x18] = '\0';
  data[0x19] = '\0';
  data[0x1a] = '\0';
  data[0x1b] = '\0';
  data[0x1c] = '\0';
  data[0x1d] = '\0';
  data[0x1e] = '\0';
  data[0x1f] = '\0';
  data[0x20] = '\0';
  data[0x21] = '\0';
  data[0x22] = '\0';
  data[0x23] = '\0';
  data[0x24] = '\0';
  data[0x25] = '\0';
  data[0x26] = '\0';
  data[0x27] = '\0';
  data[0x28] = '\0';
  data[0x29] = '\0';
  data[0x2a] = '\0';
  data[0x2b] = '\0';
  data[0x2c] = '\0';
  data[0x2d] = '\0';
  data[0x2e] = '\0';
  data[0x2f] = '\0';
  data[0x30] = '\0';
  data[0x31] = '\0';
  data[0x32] = '\0';
  data[0x33] = '\0';
  data[0x34] = '\0';
  data[0x35] = '\0';
  data[0x36] = '\0';
  data[0x37] = '\0';
  data[0x38] = '\0';
  data[0x39] = '\0';
  data[0x3a] = '\0';
  data[0x3b] = '\0';
  data[0x3c] = '\0';
  data[0x3d] = '\0';
  data[0x3e] = '\0';
  data[0x3f] = '\0';
  data[0x40] = '\0';
  data[0x41] = '\0';
  data[0x42] = '\0';
  data[0x43] = '\0';
  data[0x44] = '\0';
  data[0x45] = '\0';
  data[0x46] = '\0';
  data[0x47] = '\0';
  data[0x48] = '\0';
  data[0x49] = '\0';
  data[0x4a] = '\0';
  data[0x4b] = '\0';
  data[0x4c] = '\0';
  data[0x4d] = '\0';
  data[0x4e] = '\0';
  data[0x4f] = '\0';
  data[0x50] = '\0';
  data[0x51] = '\0';
  data[0x52] = '\0';
  data[0x53] = '\0';
  data[0x54] = '\0';
  data[0x55] = '\0';
  data[0x56] = '\0';
  data[0x57] = '\0';
  data[0x58] = '\0';
  data[0x59] = '\0';
  data[0x5a] = '\0';
  data[0x5b] = '\0';
  data[0x5c] = '\0';
  data[0x5d] = '\0';
  data[0x5e] = '\0';
  data[0x5f] = '\0';
  data[0x60] = '\0';
  data[0x61] = '\0';
  data[0x62] = '\0';
  data[99] = '\0';
  __stream_00 = fopen("../../examples/example_files.cpp","r");
  __stream = _stdout;
  uVar1 = getc(__stream_00);
  iVar2 = 0;
  uVar3 = (uchar)uVar1 + '\x01';
  *data = uVar3;
  if (uVar3 != '\0') {
    *data = (uchar)uVar1;
    fputc(uVar1 & 0xff,__stream);
    iVar2 = libbrain::
            state<6U,_(libbrain::bfop)5,_(libbrain::bfop)6,_(libbrain::bfop)5,_(libbrain::bfop)0,_(libbrain::bfop)7,_(libbrain::bfop)1,_(libbrain::bfop)4,_(libbrain::bfop)5,_(libbrain::bfop)0,_(libbrain::bfop)8,_(libbrain::bfop)9>
            ::exec(data,0,(FILE *)__stream,(FILE *)__stream_00);
  }
  fclose(__stream_00);
  operator_delete__(data);
  return iVar2;
}

Assistant:

int main() {
    auto* data = BRAIN_ALLOC_TAPE(100);

    // the simple cat program. Simply reads until such a time as it gets code -1 (EOF)
    BRAIN_PROGRAM file_cat = BRAIN_COMPILE(,+[-.,+]);

    // This path works for me. It might not for you. Sorry about that.
    FILE* self = fopen("../../examples/example_files.cpp", "r");

    int status_code = file_cat.exec(data, 0, stdout, self);

    fclose(self);

    delete[] data;

    return status_code;
}